

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

bool glcts::PipelineStatisticsQueryTestFunctional2::executeCopyImageSubDataTest(void *pThis)

{
  bool bVar1;
  int iVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  bool result;
  Functions *gl;
  PipelineStatisticsQueryTestFunctional2 *data_ptr;
  void *pThis_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext(*(Context **)((long)pThis + 0x70));
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  pRVar3 = deqp::Context::getRenderContext(*(Context **)((long)pThis + 0x70));
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,3);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  if ((bVar1) || (*(long *)(lVar4 + 0x310) != 0)) {
    (**(code **)(lVar4 + 0x310))
              (*(undefined4 *)((long)pThis + 0xdc),0xde1,0,0,0,0,*(undefined4 *)((long)pThis + 0xe0)
               ,0xde1,0,0,0,0,*(uint *)((long)pThis + 0xe8) >> 1,*(uint *)((long)pThis + 0xe4) >> 1,
               1);
    err = (**(code **)(lVar4 + 0x800))();
    glu::checkError(err,"glCopyImageSubData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                    ,0xad5);
    pThis_local._7_1_ = true;
  }
  else {
    pThis_local._7_1_ = false;
  }
  return pThis_local._7_1_;
}

Assistant:

bool PipelineStatisticsQueryTestFunctional2::executeCopyImageSubDataTest(void* pThis)
{
	PipelineStatisticsQueryTestFunctional2* data_ptr = (PipelineStatisticsQueryTestFunctional2*)pThis;
	const glw::Functions&					gl		 = data_ptr->m_context.getRenderContext().getFunctions();
	bool									result   = true;

	if (!glu::contextSupports(data_ptr->m_context.getRenderContext().getType(), glu::ApiType::core(4, 3)) &&
		gl.copyImageSubData == NULL)
	{
		/* API is unavailable */
		return false;
	}

	/* Execute the API call */
	gl.copyImageSubData(data_ptr->m_to_draw_fbo_id, GL_TEXTURE_2D, 0,			 /* srcLevel */
						0,														 /* srcX */
						0,														 /* srcY */
						0,														 /* srcZ */
						data_ptr->m_to_read_fbo_id, GL_TEXTURE_2D, 0,			 /* dstLevel */
						0,														 /* dstX */
						0,														 /* dstY */
						0,														 /* dstZ */
						data_ptr->m_to_width / 2, data_ptr->m_to_height / 2, 1); /* src_depth */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCopyImageSubData() call failed.");

	/* All done */
	return result;
}